

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O1

bool __thiscall s2coding::EncodedStringVector::Init(EncodedStringVector *this,Decoder *decoder)

{
  uint32 uVar1;
  uchar *puVar2;
  bool bVar3;
  unsigned_long_long uVar4;
  S2LogMessage SStack_28;
  
  bVar3 = EncodedUintVector<unsigned_long_long>::Init(&this->offsets_,decoder);
  if (bVar3) {
    this->data_ = (char *)decoder->buf_;
    uVar1 = (this->offsets_).size_;
    if (uVar1 == 0) {
      return true;
    }
    uVar4 = EncodedUintVector<unsigned_long_long>::operator[](&this->offsets_,uVar1 - 1);
    puVar2 = decoder->buf_;
    if (decoder->limit_ < puVar2) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                 ,0x1a1,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
      abort();
    }
    if (uVar4 <= (ulong)((long)decoder->limit_ - (long)puVar2)) {
      decoder->buf_ = puVar2 + uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool EncodedStringVector::Init(Decoder* decoder) {
  if (!offsets_.Init(decoder)) return false;
  data_ = reinterpret_cast<const char*>(decoder->ptr());
  if (offsets_.size() > 0) {
    uint64 length = offsets_[offsets_.size() - 1];
    if (decoder->avail() < length) return false;
    decoder->skip(length);
  }
  return true;
}